

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_digests.c
# Opt level: O0

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests,char *value,size_t len)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  undefined1 local_70 [8];
  h2o_iovec_t token_value;
  int skip;
  int complete;
  int validators;
  int reset;
  size_t gcs_base64_len;
  char *gcs_base64;
  size_t token_len;
  char *token;
  h2o_iovec_t iter;
  size_t len_local;
  char *value_local;
  h2o_cache_digests_t **digests_local;
  
  iter.len = len;
  _token = h2o_iovec_init(value,len);
  do {
    bVar1 = false;
    skip = 0;
    token_value.len._4_4_ = 0;
    token_value.len._0_4_ = 0;
    gcs_base64_len =
         (size_t)h2o_next_token((h2o_iovec_t *)&token,0x3b,(size_t *)&validators,(h2o_iovec_t *)0x0)
    ;
    if ((char *)gcs_base64_len == (char *)0x0) {
      return;
    }
    while( true ) {
      token_len = (size_t)h2o_next_token((h2o_iovec_t *)&token,0x3b,(size_t *)&gcs_base64,
                                         (h2o_iovec_t *)local_70);
      bVar3 = false;
      if ((char *)token_len != (char *)0x0) {
        iVar2 = h2o_memis((void *)token_len,(size_t)gcs_base64,",",1);
        bVar3 = iVar2 == 0;
      }
      if (!bVar3) break;
      iVar2 = h2o_lcstris((char *)token_len,(size_t)gcs_base64,"reset",5);
      if (iVar2 == 0) {
        iVar2 = h2o_lcstris((char *)token_len,(size_t)gcs_base64,"validators",10);
        if (iVar2 == 0) {
          iVar2 = h2o_lcstris((char *)token_len,(size_t)gcs_base64,"complete",8);
          if (iVar2 == 0) {
            token_value.len._0_4_ = 1;
          }
          else {
            token_value.len._4_4_ = 1;
          }
        }
        else {
          skip = 1;
        }
      }
      else {
        bVar1 = true;
      }
    }
    if ((bVar1) && (*digests != (h2o_cache_digests_t *)0x0)) {
      h2o_cache_digests_destroy(*digests);
      *digests = (h2o_cache_digests_t *)0x0;
    }
    if ((int)token_value.len == 0) {
      load_digest(digests,(char *)gcs_base64_len,_validators,skip,token_value.len._4_4_);
    }
  } while (token_len != 0);
  return;
}

Assistant:

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests, const char *value, size_t len)
{
    h2o_iovec_t iter = h2o_iovec_init(value, len);
    const char *token;
    size_t token_len;

    do {
        const char *gcs_base64;
        size_t gcs_base64_len;
        int reset = 0, validators = 0, complete = 0, skip = 0;
        h2o_iovec_t token_value;

        if ((gcs_base64 = h2o_next_token(&iter, ';', &gcs_base64_len, NULL)) == NULL)
            return;
        while ((token = h2o_next_token(&iter, ';', &token_len, &token_value)) != NULL &&
               !h2o_memis(token, token_len, H2O_STRLIT(","))) {
            if (h2o_lcstris(token, token_len, H2O_STRLIT("reset"))) {
                reset = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("validators"))) {
                validators = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("complete"))) {
                complete = 1;
            } else {
                skip = 1;
            }
        }

        if (reset && *digests != NULL) {
            h2o_cache_digests_destroy(*digests);
            *digests = NULL;
        }

        if (skip) {
            /* not supported for the time being */
        } else {
            load_digest(digests, gcs_base64, gcs_base64_len, validators, complete);
        }
    } while (token != NULL);
}